

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<float>::Resize(RepeatedField<float> *this,int new_size,float *value)

{
  float fVar1;
  Rep *pRVar2;
  LogMessage *other;
  long lVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pRVar2 = this->rep_;
    fVar1 = *value;
    for (lVar3 = (long)this->current_size_ << 2; (long)new_size * 4 != lVar3; lVar3 = lVar3 + 4) {
      *(float *)((long)pRVar2->elements + lVar3) = fVar1;
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&rep_->elements[current_size_],
              &rep_->elements[new_size], value);
  }
  current_size_ = new_size;
}